

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int checkTreePage(IntegrityCk *pCheck,Pgno iPage,i64 *piMinKey,i64 maxKey)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  char *pcVar9;
  BtShared *pBt;
  u8 *puVar10;
  bool bVar11;
  bool bVar12;
  Pgno PVar13;
  int iVar14;
  MemPage *pPage_00;
  ushort uVar15;
  u16 uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  u32 uVar20;
  ulong uVar21;
  uint uVar22;
  ushort *puVar23;
  long lVar24;
  uint uVar25;
  char *zFormat;
  u8 *p;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  u32 *aHeap;
  long in_FS_OFFSET;
  int local_114;
  undefined1 local_68 [20];
  ushort uStack_54;
  ushort uStack_52;
  MemPage *pPage;
  i64 maxKey_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPage = (MemPage *)0x0;
  pcVar9 = pCheck->zPfx;
  PVar13 = pCheck->v1;
  iVar14 = pCheck->v2;
  maxKey_local = maxKey;
  checkProgress(pCheck);
  local_114 = -1;
  if (pCheck->mxErr == 0) goto LAB_00153f3c;
  local_114 = 0;
  if (iPage == 0) goto LAB_00153f5e;
  pBt = pCheck->pBt;
  uVar8 = pBt->usableSize;
  iVar17 = checkRef(pCheck,iPage);
  local_114 = 0;
  if (iVar17 != 0) goto LAB_00153f5e;
  pCheck->zPfx = "Tree %u page %u: ";
  pCheck->v1 = iPage;
  uVar18 = btreeGetPage(pBt,iPage,&pPage,0);
  pPage_00 = pPage;
  if (uVar18 == 0) {
    uVar1 = pPage->isInit;
    pPage->isInit = '\0';
    uVar18 = btreeInitPage(pPage);
    if (uVar18 == 0) {
      uVar18 = btreeComputeFreeSpace(pPage_00);
      if (uVar18 == 0) {
        puVar10 = pPage_00->aData;
        bVar2 = pPage_00->hdrOffset;
        uVar26 = (ulong)bVar2;
        pCheck->zPfx = "Tree %u page %u cell %u: ";
        bVar3 = puVar10[uVar26 + 5];
        bVar4 = puVar10[uVar26 + 6];
        bVar5 = puVar10[uVar26 + 3];
        bVar6 = puVar10[uVar26 + 4];
        uVar18 = (uint)bVar5 * 0x100 + (uint)bVar6;
        bVar7 = pPage_00->leaf;
        if ((bVar7 != 0) || (pPage_00->intKey == '\0')) {
          pCheck->nRow = pCheck->nRow + (ulong)uVar18;
        }
        uVar19 = ((uint)bVar3 * 0x100 + (uint)bVar4) - 1 & 0xffff;
        bVar12 = true;
        if (bVar7 == 0) {
          uVar20 = sqlite3Get4byte(puVar10 + uVar26 + 8);
          if (pBt->autoVacuum != '\0') {
            pCheck->zPfx = "Tree %u page %u right child: ";
            checkPtrmap(pCheck,uVar20,'\x05',iPage);
          }
          local_114 = checkTreePage(pCheck,uVar20,&maxKey_local,maxKey);
          bVar11 = false;
          aHeap = (u32 *)0x0;
        }
        else {
          aHeap = pCheck->heap;
          *aHeap = 0;
          local_114 = -1;
          bVar11 = true;
        }
        puVar23 = (ushort *)
                  (puVar10 + (long)(int)((uint)bVar2 + (uint)bVar7 * -4 + uVar18 * 2 + -2) + 0xc);
        uVar25 = uVar8 - 4;
        while ((uVar18 = uVar18 - 1, -1 < (int)uVar18 && (pCheck->mxErr != 0))) {
          stack0xffffffffffffffa8 = &DAT_aaaaaaaaaaaaaaaa;
          local_68._0_4_ = 0xaaaaaaaa;
          local_68._4_4_ = 0xaaaaaaaa;
          local_68._8_4_ = 0xaaaaaaaa;
          local_68._12_4_ = 0xaaaaaaaa;
          pCheck->v2 = uVar18;
          uVar15 = *puVar23 << 8 | *puVar23 >> 8;
          uVar22 = (uint)uVar15;
          if (uVar25 < uVar22 || uVar15 <= uVar19) {
            bVar12 = false;
            checkAppendMsg(pCheck,"Offset %u out of range %u..%u",(ulong)uVar15,(ulong)(uVar19 + 1),
                           (ulong)uVar25);
          }
          else {
            p = puVar10 + uVar22;
            (*pPage_00->xParseCell)(pPage_00,p,(CellInfo *)local_68);
            if (uVar8 < uStack_52 + uVar22) {
              bVar12 = false;
              checkAppendMsg(pCheck,"Extends off end of page");
            }
            else {
              if (pPage_00->intKey != '\0') {
                lVar24 = CONCAT44(local_68._4_4_,local_68._0_4_);
                if (bVar11) {
                  if (maxKey_local < lVar24) {
LAB_001541fc:
                    checkAppendMsg(pCheck,"Rowid %lld out of order");
                    lVar24 = CONCAT44(local_68._4_4_,local_68._0_4_);
                  }
                }
                else if (maxKey_local <= lVar24) goto LAB_001541fc;
                bVar11 = false;
                maxKey_local = lVar24;
              }
              if ((uint)uStack_54 < (uint)local_68._16_4_) {
                iVar17 = local_68._16_4_ + (uVar8 - 5);
                uVar28 = (uint)uStack_54;
                uVar20 = sqlite3Get4byte(p + (((ulong)stack0xffffffffffffffa8 >> 0x30) - 4));
                if (pBt->autoVacuum != '\0') {
                  checkPtrmap(pCheck,uVar20,'\x03',iPage);
                }
                checkList(pCheck,0,uVar20,(iVar17 - uVar28) / uVar25);
              }
              if (pPage_00->leaf == '\0') {
                uVar20 = sqlite3Get4byte(p);
                if (pBt->autoVacuum != '\0') {
                  checkPtrmap(pCheck,uVar20,'\x05',iPage);
                }
                iVar17 = checkTreePage(pCheck,uVar20,&maxKey_local,maxKey_local);
                if (iVar17 == local_114) {
                  bVar11 = false;
                }
                else {
                  bVar11 = false;
                  checkAppendMsg(pCheck,"Child page depth differs");
                  local_114 = iVar17;
                }
              }
              else {
                btreeHeapInsert(aHeap,((uint)uStack_52 + (uint)uVar15) - 1 | uVar22 << 0x10);
              }
            }
          }
          puVar23 = puVar23 + -1;
        }
        *piMinKey = maxKey_local;
        pCheck->zPfx = (char *)0x0;
        if (bVar12) {
          if (0 < pCheck->mxErr) {
            if (pPage_00->leaf == '\0') {
              aHeap = pCheck->heap;
              *aHeap = 0;
              for (uVar21 = (ulong)CONCAT11(bVar5,bVar6); 0 < (long)uVar21; uVar21 = uVar21 - 1) {
                uVar15 = *(ushort *)(puVar10 + uVar21 * 2 + uVar26 + (ulong)bVar7 * -4 + 10) << 8 |
                         *(ushort *)(puVar10 + uVar21 * 2 + uVar26 + (ulong)bVar7 * -4 + 10) >> 8;
                uVar16 = (*pPage_00->xCellSize)(pPage_00,puVar10 + uVar15);
                btreeHeapInsert(aHeap,((uint)uVar16 + (uint)uVar15) - 1 | (uint)uVar15 << 0x10);
              }
            }
            uVar21 = uVar26 + 1;
            lVar24 = uVar26 + 2;
            while( true ) {
              uVar15 = CONCAT11(puVar10[uVar21],puVar10[lVar24]);
              uVar21 = (ulong)uVar15;
              if (uVar21 == 0) break;
              lVar24 = uVar21 + 1;
              btreeHeapInsert(aHeap,((uint)uVar15 +
                                    (uint)(ushort)(*(ushort *)(puVar10 + uVar21 + 2) << 8 |
                                                  *(ushort *)(puVar10 + uVar21 + 2) >> 8)) - 1 |
                                    (uint)uVar15 << 0x10);
            }
            uVar18 = *aHeap;
            iVar17 = 0;
            while (uVar18 != 0) {
              uVar25 = aHeap[1];
              aHeap[1] = aHeap[uVar18];
              aHeap[uVar18] = 0xffffffff;
              uVar18 = uVar18 - 1;
              *aHeap = uVar18;
              uVar21 = 1;
              while (uVar22 = (int)uVar21 * 2, uVar22 <= uVar18) {
                uVar27 = (ulong)(uVar22 | 1);
                if (aHeap[uVar22] <= aHeap[uVar27]) {
                  uVar27 = (ulong)uVar22;
                }
                uVar22 = aHeap[uVar21];
                if (uVar22 < aHeap[uVar27]) break;
                aHeap[uVar21] = aHeap[uVar27];
                aHeap[uVar27] = uVar22;
                uVar21 = uVar27;
                uVar18 = *aHeap;
              }
              uVar22 = uVar25 >> 0x10;
              uVar28 = ~(uVar19 & 0xffff);
              if (uVar22 <= (uVar19 & 0xffff)) {
                checkAppendMsg(pCheck,"Multiple uses for byte %u of page %u",(ulong)uVar22,
                               (ulong)iPage);
                if (*aHeap != 0) goto LAB_00153f3c;
                uVar28 = iVar17 + uVar8 + uVar28;
                goto LAB_001544de;
              }
              iVar17 = iVar17 + uVar22 + uVar28;
              uVar19 = uVar25;
            }
            uVar28 = iVar17 + uVar8 + (~uVar19 | 0xffff0000);
LAB_001544de:
            if (uVar28 != puVar10[uVar26 + 7]) {
              checkAppendMsg(pCheck,"Fragmentation of %u bytes reported as %u on page %u",
                             (ulong)uVar28,(ulong)puVar10[uVar26 + 7],(ulong)iPage);
            }
          }
        }
        else {
          pPage_00->isInit = uVar1;
        }
        goto LAB_00153f3c;
      }
      zFormat = "free space corruption";
    }
    else {
      zFormat = "btreeInitPage() returns error code %d";
    }
    checkAppendMsg(pCheck,zFormat,(ulong)uVar18);
    local_114 = -1;
  }
  else {
    checkAppendMsg(pCheck,"unable to get the page. error code=%d",(ulong)uVar18);
    local_114 = -1;
    if (uVar18 == 0xc0a) {
      pCheck->rc = 7;
    }
  }
LAB_00153f3c:
  releasePage(pPage);
  pCheck->zPfx = pcVar9;
  pCheck->v1 = PVar13;
  pCheck->v2 = iVar14;
  local_114 = local_114 + 1;
LAB_00153f5e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_114;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  Pgno iPage,           /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  checkProgress(pCheck);
  if( pCheck->mxErr==0 ) goto end_of_check;
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Tree %u page %u: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    if( rc==SQLITE_IOERR_NOMEM ) pCheck->rc = SQLITE_NOMEM;
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  if( (rc = btreeComputeFreeSpace(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );
    checkAppendMsg(pCheck, "free space corruption", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "Tree %u page %u cell %u: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );
  if( pPage->leaf || pPage->intKey==0 ){
    pCheck->nRow += nCell;
  }

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "Tree %u page %u right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %u out of range %u..%u",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      u32 nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    assert( heap!=0 );
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page.
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize ); /* due to btreeComputeFreeSpace() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );     /* Enforced by btreeComputeFreeSpace() */
      assert( (u32)j<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    **
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %u", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %u bytes reported as %u on page %u",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}